

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImStrdupcpy(char *dst,size_t *p_dst_size,char *src)

{
  size_t sVar1;
  ulong size;
  undefined8 local_38;
  size_t src_size;
  size_t dst_buf_size;
  char *src_local;
  size_t *p_dst_size_local;
  char *dst_local;
  
  if (p_dst_size == (size_t *)0x0) {
    sVar1 = strlen(dst);
    local_38 = sVar1 + 1;
  }
  else {
    local_38 = *p_dst_size;
  }
  sVar1 = strlen(src);
  size = sVar1 + 1;
  p_dst_size_local = (size_t *)dst;
  if (local_38 < size) {
    ImGui::MemFree(dst);
    p_dst_size_local = (size_t *)ImGui::MemAlloc(size);
    if (p_dst_size != (size_t *)0x0) {
      *p_dst_size = size;
    }
  }
  memcpy(p_dst_size_local,src,size);
  return (char *)p_dst_size_local;
}

Assistant:

char* ImStrdupcpy(char* dst, size_t* p_dst_size, const char* src)
{
    size_t dst_buf_size = p_dst_size ? *p_dst_size : strlen(dst) + 1;
    size_t src_size = strlen(src) + 1;
    if (dst_buf_size < src_size)
    {
        IM_FREE(dst);
        dst = (char*)IM_ALLOC(src_size);
        if (p_dst_size)
            *p_dst_size = src_size;
    }
    return (char*)memcpy(dst, (const void*)src, src_size);
}